

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall
OpenMD::MatrixAccumulator::get95percentConfidenceInterval(MatrixAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  ResultType *pRVar4;
  Mat3x3d sd;
  ResultType local_68;
  
  pRVar4 = &local_68;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  getStdDev(this,&local_68);
  sVar1 = (this->super_BaseAccumulator).Count_;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar3] = (*(double *)((long)pRVar4 + lVar3 * 8) * 1.96) /
                SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pRVar4 = (ResultType *)((long)pRVar4 + 0x18);
    ret = (ResultType *)((long)ret + 0x18);
  } while (lVar2 != 3);
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = 1.960 * sd(i, j) / sqrt(RealType(Count_));
        }
      }
      return;
    }